

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglfskmsgbmdevice.cpp
# Opt level: O2

void __thiscall
QEglFSKmsGbmDevice::createGlobalCursor(QEglFSKmsGbmDevice *this,QEglFSKmsGbmScreen *screen)

{
  QKmsScreenConfig *pQVar1;
  long lVar2;
  QEglFSKmsGbmCursor *this_00;
  long in_FS_OFFSET;
  char local_40 [24];
  undefined8 local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_globalCursor == (QEglFSKmsGbmCursor *)0x0) {
    pQVar1 = QKmsDevice::screenConfig((QKmsDevice *)this);
    if (pQVar1->m_hwCursor == true) {
      lVar2 = QtPrivateLogging::qLcEglfsKmsDebug();
      if ((*(byte *)(lVar2 + 0x10) & 1) != 0) {
        local_28 = *(undefined8 *)(lVar2 + 8);
        local_40[0] = '\x02';
        local_40[1] = '\0';
        local_40[2] = '\0';
        local_40[3] = '\0';
        local_40[4] = '\0';
        local_40[5] = '\0';
        local_40[6] = '\0';
        local_40[7] = '\0';
        local_40[8] = '\0';
        local_40[9] = '\0';
        local_40[10] = '\0';
        local_40[0xb] = '\0';
        local_40[0xc] = '\0';
        local_40[0xd] = '\0';
        local_40[0xe] = '\0';
        local_40[0xf] = '\0';
        local_40[0x10] = '\0';
        local_40[0x11] = '\0';
        local_40[0x12] = '\0';
        local_40[0x13] = '\0';
        local_40[0x14] = '\0';
        local_40[0x15] = '\0';
        local_40[0x16] = '\0';
        local_40[0x17] = '\0';
        QMessageLogger::debug(local_40,"Creating new global GBM mouse cursor");
      }
      this_00 = (QEglFSKmsGbmCursor *)operator_new(0xa8);
      QEglFSKmsGbmCursor::QEglFSKmsGbmCursor(this_00,screen);
      this->m_globalCursor = this_00;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QEglFSKmsGbmDevice::createGlobalCursor(QEglFSKmsGbmScreen *screen)
{
    if (!m_globalCursor && screenConfig()->hwCursor()) {
        qCDebug(qLcEglfsKmsDebug, "Creating new global GBM mouse cursor");
        m_globalCursor = new QEglFSKmsGbmCursor(screen);
    }
}